

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O3

void __thiscall RenderTest_RadianceMatches_Test::TestBody(RenderTest_RadianceMatches_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ParamType *pPVar3;
  char *message;
  AssertionResult gtest_ar;
  AssertHelper local_78;
  long local_70;
  undefined1 local_68 [16];
  string local_58;
  int local_34;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  int local_1c;
  
  pPVar3 = testing::WithParamInterface<TestIntegrator>::GetParam
                     (&(this->super_RenderTest).super_TestWithParam<TestIntegrator>.
                       super_WithParamInterface<TestIntegrator>);
  (*pPVar3->integrator->_vptr_Integrator[3])();
  local_78.data_ = (AssertHelperData *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"test.exr","");
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,local_78.data_,
             (undefined1 *)((long)&(local_78.data_)->type + local_70));
  CheckSceneAverage(&local_58,(pPVar3->scene).expected);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78.data_ != (AssertHelperData *)local_68) {
    operator_delete(local_78.data_,local_68._0_8_ + 1);
  }
  if (pPVar3->integrator != (Integrator *)0x0) {
    (*pPVar3->integrator->_vptr_Integrator[1])();
  }
  local_34 = 0;
  local_78.data_ = (AssertHelperData *)local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"test.exr","");
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,local_78.data_,
             (undefined1 *)((long)&(local_78.data_)->type + local_70));
  local_1c = remove(local_58._M_dataplus._M_p);
  testing::internal::CmpHelperEQ<int,int>
            (local_30,"0","remove(inTestDir(\"test.exr\").c_str())",&local_34,&local_1c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_78.data_ != (AssertHelperData *)local_68) {
    operator_delete(local_78.data_,local_68._0_8_ + 1);
  }
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/cpu/integrators_test.cpp"
               ,0x1a9,message);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_58._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_P(RenderTest, RadianceMatches) {
    const TestIntegrator &tr = GetParam();
    tr.integrator->Render();
    CheckSceneAverage(inTestDir("test.exr"), tr.scene.expected);
    // The SpatialLightSampler class keeps a per-thread cache that
    // must be cleared out between test runs. In turn, this means that we
    // must delete the Integrator here in order to make sure that its
    // destructor runs. (This is ugly and should be fixed in a better way.)
    delete tr.integrator;

    EXPECT_EQ(0, remove(inTestDir("test.exr").c_str()));
}